

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_archiver_zip.c
# Opt level: O1

ZIPentry * zip_load_entry(ZIPinfo *info,int zip64,PHYSFS_uint64 ofs_fixup)

{
  PHYSFS_Io *io;
  _func_PHYSFS_sint64_PHYSFS_Io_ptr *p_Var1;
  _func_int_PHYSFS_Io_ptr_PHYSFS_uint64 *p_Var2;
  int iVar3;
  ZipResolveType ZVar4;
  char *pcVar5;
  char *pcVar6;
  ZIPentry *pZVar7;
  undefined1 *puVar8;
  PHYSFS_ErrorCode errcode;
  undefined1 *ptr;
  ushort uVar9;
  ushort uVar10;
  ulong _len;
  bool bVar11;
  undefined1 auStack_118 [8];
  PHYSFS_uint64 offset;
  int local_108;
  int iStack_104;
  undefined8 uStack_100;
  undefined8 local_f8;
  long lStack_f0;
  char *local_e8;
  undefined8 uStack_d8;
  ZIPentry entry;
  uint local_54;
  ushort local_50;
  ushort local_4e;
  PHYSFS_uint32 external_attr;
  PHYSFS_uint16 fnamelen;
  PHYSFS_uint16 commentlen;
  PHYSFS_uint16 ui16;
  PHYSFS_uint16 local_3e;
  uint local_3c;
  PHYSFS_uint16 sig;
  PHYSFS_uint32 ui32;
  PHYSFS_uint16 len;
  
  puVar8 = auStack_118;
  io = info->io;
  iVar3 = readui32(io,&local_3c);
  if (iVar3 == 0) {
    return (ZIPentry *)0x0;
  }
  if (local_3c == 0x2014b50) {
    entry.uncompressed_size = 0;
    entry.last_mod_time = 0;
    entry.crc = 0;
    entry._76_4_ = 0;
    entry.compressed_size = 0;
    entry.offset = 0;
    entry.version = 0;
    entry.version_needed = 0;
    entry.general_bits = 0;
    entry.compression_method = 0;
    entry.symlink = (_ZIPentry *)0x0;
    entry.resolved = ZIP_UNRESOLVED_FILE;
    entry._52_4_ = 0;
    entry.tree.sibling = (__PHYSFS_DirTreeEntry *)0x0;
    entry.tree.isdir = 0;
    entry.tree._36_4_ = 0;
    entry.tree.hashnext = (__PHYSFS_DirTreeEntry *)0x0;
    entry.tree.children = (__PHYSFS_DirTreeEntry *)0x0;
    uStack_d8 = 0;
    entry.tree.name = (char *)0x0;
    iVar3 = readui16(io,(PHYSFS_uint16 *)&entry.offset);
    if (iVar3 == 0) {
      return (ZIPentry *)0x0;
    }
    iVar3 = readui16(io,(PHYSFS_uint16 *)((long)&entry.offset + 2));
    if (iVar3 == 0) {
      return (ZIPentry *)0x0;
    }
    iVar3 = readui16(io,(PHYSFS_uint16 *)((long)&entry.offset + 4));
    if (iVar3 == 0) {
      return (ZIPentry *)0x0;
    }
    iVar3 = readui16(io,(PHYSFS_uint16 *)((long)&entry.offset + 6));
    if (iVar3 == 0) {
      return (ZIPentry *)0x0;
    }
    iVar3 = readui32(io,(PHYSFS_uint32 *)&entry.last_mod_time);
    if (iVar3 == 0) {
      return (ZIPentry *)0x0;
    }
    uStack_100._0_4_ = 0;
    uStack_100._4_4_ = 0;
    lStack_f0 = 0;
    local_e8 = (char *)0x0;
    iStack_104 = ((uint)entry.last_mod_time >> 0x19) + 0x50;
    local_108 = ((uint)entry.last_mod_time >> 0x15 & 0xf) - 1;
    offset = CONCAT44((uint)entry.last_mod_time >> 0x10,(uint)entry.last_mod_time >> 0xb) &
             0x1f0000001f;
    auStack_118 = (undefined1  [8])
                  (CONCAT44((uint)entry.last_mod_time >> 5,(uint)entry.last_mod_time * 2) &
                  0x3f0000003e);
    local_f8._0_4_ = -1;
    local_f8._4_4_ = 0;
    entry.uncompressed_size = mktime((tm *)auStack_118);
    iVar3 = readui32(io,(PHYSFS_uint32 *)&entry.version);
    if (iVar3 == 0) {
      return (ZIPentry *)0x0;
    }
    iVar3 = readui32(io,&local_3c);
    if (iVar3 == 0) {
      return (ZIPentry *)0x0;
    }
    entry._72_8_ = ZEXT48(local_3c);
    iVar3 = readui32(io,&local_3c);
    if (iVar3 == 0) {
      return (ZIPentry *)0x0;
    }
    entry.compressed_size = (PHYSFS_uint64)local_3c;
    iVar3 = readui16(io,&local_50);
    if (iVar3 == 0) {
      return (ZIPentry *)0x0;
    }
    iVar3 = readui16(io,(PHYSFS_uint16 *)&ui32);
    if (iVar3 == 0) {
      return (ZIPentry *)0x0;
    }
    iVar3 = readui16(io,&local_4e);
    if (iVar3 == 0) {
      return (ZIPentry *)0x0;
    }
    iVar3 = readui16(io,(PHYSFS_uint16 *)&external_attr);
    if (iVar3 == 0) {
      return (ZIPentry *)0x0;
    }
    iVar3 = readui16(io,(PHYSFS_uint16 *)&external_attr);
    if (iVar3 == 0) {
      return (ZIPentry *)0x0;
    }
    iVar3 = readui32(io,&local_54);
    if (iVar3 == 0) {
      return (ZIPentry *)0x0;
    }
    iVar3 = readui32(io,&local_3c);
    if (iVar3 == 0) {
      return (ZIPentry *)0x0;
    }
    external_attr._2_2_ = (short)external_attr;
    auStack_118 = (undefined1  [8])(ulong)local_3c;
    _len = (ulong)local_50;
    if (_len < 0xff) {
      ptr = auStack_118 + -(ulong)(local_50 + 0x18 & 0xfffffff0);
      puVar8 = ptr;
    }
    else {
      ptr = (undefined1 *)0x0;
      puVar8 = auStack_118;
    }
    *(undefined8 *)(puVar8 + -8) = 0x116c87;
    pcVar5 = (char *)__PHYSFS_initSmallAlloc(ptr,_len + 1);
    if (pcVar5 != (char *)0x0) {
      _fnamelen = pcVar5;
      *(undefined8 *)(puVar8 + -8) = 0x116ca2;
      iVar3 = __PHYSFS_readAll(io,pcVar5,_len);
      pcVar5 = _fnamelen;
      if (iVar3 == 0) {
        *(undefined8 *)(puVar8 + -8) = 0x116d41;
        __PHYSFS_smallFree(pcVar5);
        return (ZIPentry *)0x0;
      }
      sig._1_1_ = _fnamelen[_len - 1];
      bVar11 = sig._1_1_ == '/';
      if (bVar11) {
        _fnamelen[_len - 1] = '\0';
      }
      _fnamelen[_len] = '\0';
      pcVar6 = _fnamelen;
      if ((ushort)entry.offset < 0x100) {
        do {
          if (*pcVar6 == '\\') {
            *pcVar6 = '/';
          }
          else if (*pcVar6 == '\0') break;
          pcVar6 = pcVar6 + 1;
        } while( true );
      }
      *(undefined8 *)(puVar8 + -8) = 0x116cfb;
      pZVar7 = (ZIPentry *)__PHYSFS_DirTreeAdd(&info->tree,pcVar5,(uint)bVar11);
      *(undefined8 *)(puVar8 + -8) = 0x116d06;
      __PHYSFS_smallFree(pcVar5);
      if (pZVar7 != (ZIPentry *)0x0) {
        if (pZVar7->last_mod_time == 0) {
          *(undefined8 *)(puVar8 + -8) = 0x116d58;
          memcpy(&pZVar7->symlink,&entry.tree.isdir,0x48);
          pZVar7->symlink = (_ZIPentry *)0x0;
          ZVar4 = ZIP_DIRECTORY;
          if (sig._1_1_ != '/') {
            if (((pZVar7->version < 0x1300) &&
                ((0x4e857U >> (pZVar7->version >> 8 & 0x1f) & 1) != 0)) ||
               (pZVar7->uncompressed_size == 0)) {
              ZVar4 = ZIP_UNRESOLVED_FILE;
            }
            else {
              ZVar4 = (ZipResolveType)((local_54 & 0xf0000000) == 0xa0000000);
            }
          }
          pZVar7->resolved = ZVar4;
          p_Var1 = io->tell;
          *(undefined8 *)(puVar8 + -8) = 0x116dad;
          _fnamelen = (char *)(*p_Var1)(io);
          if (_fnamelen == (char *)0xffffffffffffffff) {
            return (ZIPentry *)0x0;
          }
          if ((zip64 != 0) &&
             (((local_3c == 0xffffffff || (pZVar7->compressed_size == 0xffffffff)) ||
              (pZVar7->uncompressed_size == 0xffffffff)))) {
            local_3e = 0;
            ui32._2_2_ = 0;
            uVar10 = (ushort)ui32;
            do {
              ui32._0_2_ = uVar10;
              if (uVar10 < 5) {
LAB_00116e5f:
                uVar9 = ui32._2_2_;
                if (4 < uVar10) {
                  if (pZVar7->uncompressed_size == 0xffffffff) {
                    if (ui32._2_2_ < 8) goto LAB_00116e6b;
                    *(undefined8 *)(puVar8 + -8) = 0x116ede;
                    iVar3 = readui64(io,&pZVar7->uncompressed_size);
                    if (iVar3 == 0) break;
                    ui32._2_2_ = uVar9 - 8;
                  }
                  uVar10 = ui32._2_2_;
                  if (pZVar7->compressed_size == 0xffffffff) {
                    if (ui32._2_2_ < 8) goto LAB_00116e6b;
                    *(undefined8 *)(puVar8 + -8) = 0x116f0d;
                    iVar3 = readui64(io,&pZVar7->compressed_size);
                    if (iVar3 == 0) break;
                    ui32._2_2_ = uVar10 - 8;
                  }
                  uVar10 = ui32._2_2_;
                  if (local_3c == 0xffffffff) {
                    if (ui32._2_2_ < 8) goto LAB_00116e6b;
                    *(undefined8 *)(puVar8 + -8) = 0x116f55;
                    iVar3 = readui64(io,(PHYSFS_uint64 *)auStack_118);
                    if (iVar3 == 0) break;
                    ui32._2_2_ = uVar10 - 8;
                  }
                  if (ui32._2_2_ == 0) {
                    bVar11 = true;
                    goto LAB_00116e77;
                  }
                }
LAB_00116e6b:
                *(undefined8 *)(puVar8 + -8) = 0x116e75;
                PHYSFS_setErrorCode(PHYSFS_ERR_CORRUPT);
                break;
              }
              *(undefined8 *)(puVar8 + -8) = 0x116e07;
              iVar3 = readui16(io,&local_3e);
              if (iVar3 == 0) break;
              *(undefined8 *)(puVar8 + -8) = 0x116e17;
              iVar3 = readui16(io,(PHYSFS_uint16 *)((long)&ui32 + 2));
              if (iVar3 == 0) break;
              pcVar5 = _fnamelen + (ulong)ui32._2_2_ + 4;
              uVar9 = uVar10 - (ui32._2_2_ + 4);
              _fnamelen = pcVar5;
              ui32._0_2_ = uVar9;
              if (local_3e == 1) goto LAB_00116e5f;
              p_Var2 = io->seek;
              *(undefined8 *)(puVar8 + -8) = 0x116e49;
              iVar3 = (*p_Var2)(io,(PHYSFS_uint64)pcVar5);
              uVar10 = uVar9;
            } while (iVar3 != 0);
            bVar11 = false;
LAB_00116e77:
            if (!bVar11) {
              return (ZIPentry *)0x0;
            }
          }
          if (external_attr._2_2_ == 0) {
            pZVar7->offset = ofs_fixup + (long)auStack_118;
            pcVar5 = _fnamelen + (ulong)local_4e + (ulong)(ushort)ui32;
            p_Var2 = io->seek;
            *(undefined8 *)(puVar8 + -8) = 0x116ead;
            iVar3 = (*p_Var2)(io,(PHYSFS_uint64)pcVar5);
            if (iVar3 == 0) {
              return (ZIPentry *)0x0;
            }
            return pZVar7;
          }
        }
        goto LAB_00116d12;
      }
    }
    errcode = PHYSFS_ERR_OUT_OF_MEMORY;
  }
  else {
LAB_00116d12:
    errcode = PHYSFS_ERR_CORRUPT;
  }
  *(undefined8 *)(puVar8 + -8) = 0x116d1c;
  PHYSFS_setErrorCode(errcode);
  return (ZIPentry *)0x0;
}

Assistant:

static ZIPentry *zip_load_entry(ZIPinfo *info, const int zip64,
                                const PHYSFS_uint64 ofs_fixup)
{
    PHYSFS_Io *io = info->io;
    ZIPentry entry;
    ZIPentry *retval = NULL;
    PHYSFS_uint16 fnamelen, extralen, commentlen;
    PHYSFS_uint32 external_attr;
    PHYSFS_uint32 starting_disk;
    PHYSFS_uint64 offset;
    PHYSFS_uint16 ui16;
    PHYSFS_uint32 ui32;
    PHYSFS_sint64 si64;
    char *name = NULL;
    int isdir = 0;

    /* sanity check with central directory signature... */
    BAIL_IF_ERRPASS(!readui32(io, &ui32), NULL);
    BAIL_IF(ui32 != ZIP_CENTRAL_DIR_SIG, PHYSFS_ERR_CORRUPT, NULL);

    memset(&entry, '\0', sizeof (entry));

    /* Get the pertinent parts of the record... */
    BAIL_IF_ERRPASS(!readui16(io, &entry.version), NULL);
    BAIL_IF_ERRPASS(!readui16(io, &entry.version_needed), NULL);
    BAIL_IF_ERRPASS(!readui16(io, &entry.general_bits), NULL);  /* general bits */
    BAIL_IF_ERRPASS(!readui16(io, &entry.compression_method), NULL);
    BAIL_IF_ERRPASS(!readui32(io, &entry.dos_mod_time), NULL);
    entry.last_mod_time = zip_dos_time_to_physfs_time(entry.dos_mod_time);
    BAIL_IF_ERRPASS(!readui32(io, &entry.crc), NULL);
    BAIL_IF_ERRPASS(!readui32(io, &ui32), NULL);
    entry.compressed_size = (PHYSFS_uint64) ui32;
    BAIL_IF_ERRPASS(!readui32(io, &ui32), NULL);
    entry.uncompressed_size = (PHYSFS_uint64) ui32;
    BAIL_IF_ERRPASS(!readui16(io, &fnamelen), NULL);
    BAIL_IF_ERRPASS(!readui16(io, &extralen), NULL);
    BAIL_IF_ERRPASS(!readui16(io, &commentlen), NULL);
    BAIL_IF_ERRPASS(!readui16(io, &ui16), NULL);
    starting_disk = (PHYSFS_uint32) ui16;
    BAIL_IF_ERRPASS(!readui16(io, &ui16), NULL);  /* internal file attribs */
    BAIL_IF_ERRPASS(!readui32(io, &external_attr), NULL);
    BAIL_IF_ERRPASS(!readui32(io, &ui32), NULL);
    offset = (PHYSFS_uint64) ui32;

    name = (char *) __PHYSFS_smallAlloc(fnamelen + 1);
    BAIL_IF(!name, PHYSFS_ERR_OUT_OF_MEMORY, NULL);
    if (!__PHYSFS_readAll(io, name, fnamelen))
    {
        __PHYSFS_smallFree(name);
        return NULL;
    } /* if */

    if (name[fnamelen - 1] == '/')
    {
        name[fnamelen - 1] = '\0';
        isdir = 1;
    } /* if */
    name[fnamelen] = '\0';  /* null-terminate the filename. */

    zip_convert_dos_path(entry.version, name);

    retval = (ZIPentry *) __PHYSFS_DirTreeAdd(&info->tree, name, isdir);
    __PHYSFS_smallFree(name);

    BAIL_IF(!retval, PHYSFS_ERR_OUT_OF_MEMORY, NULL);

    /* It's okay to BAIL without freeing retval, because it's stored in the
       __PHYSFS_DirTree and will be freed later anyhow. */
    BAIL_IF(retval->last_mod_time != 0, PHYSFS_ERR_CORRUPT, NULL); /* dupe? */

    /* Move the data we already read into place in the official object. */
    memcpy(((PHYSFS_uint8 *) retval) + sizeof (__PHYSFS_DirTreeEntry),
           ((PHYSFS_uint8 *) &entry) + sizeof (__PHYSFS_DirTreeEntry),
           sizeof (*retval) - sizeof (__PHYSFS_DirTreeEntry));

    retval->symlink = NULL;  /* will be resolved later, if necessary. */

    if (isdir)
        retval->resolved = ZIP_DIRECTORY;
    else
    {
        retval->resolved = (zip_has_symlink_attr(retval, external_attr)) ?
                                ZIP_UNRESOLVED_SYMLINK : ZIP_UNRESOLVED_FILE;
    } /* else */

    si64 = io->tell(io);
    BAIL_IF_ERRPASS(si64 == -1, NULL);

    /* If the actual sizes didn't fit in 32-bits, look for the Zip64
        extended information extra field... */
    if ( (zip64) &&
         ((offset == 0xFFFFFFFF) ||
          (starting_disk == 0xFFFFFFFF) ||
          (retval->compressed_size == 0xFFFFFFFF) ||
          (retval->uncompressed_size == 0xFFFFFFFF)) )
    {
        int found = 0;
        PHYSFS_uint16 sig = 0;
        PHYSFS_uint16 len = 0;
        while (extralen > 4)
        {
            BAIL_IF_ERRPASS(!readui16(io, &sig), NULL);
            BAIL_IF_ERRPASS(!readui16(io, &len), NULL);

            si64 += 4 + len;
            extralen -= 4 + len;
            if (sig != ZIP64_EXTENDED_INFO_EXTRA_FIELD_SIG)
            {
                BAIL_IF_ERRPASS(!io->seek(io, si64), NULL);
                continue;
            } /* if */

            found = 1;
            break;
        } /* while */

        BAIL_IF(!found, PHYSFS_ERR_CORRUPT, NULL);

        if (retval->uncompressed_size == 0xFFFFFFFF)
        {
            BAIL_IF(len < 8, PHYSFS_ERR_CORRUPT, NULL);
            BAIL_IF_ERRPASS(!readui64(io, &retval->uncompressed_size), NULL);
            len -= 8;
        } /* if */

        if (retval->compressed_size == 0xFFFFFFFF)
        {
            BAIL_IF(len < 8, PHYSFS_ERR_CORRUPT, NULL);
            BAIL_IF_ERRPASS(!readui64(io, &retval->compressed_size), NULL);
            len -= 8;
        } /* if */

        if (offset == 0xFFFFFFFF)
        {
            BAIL_IF(len < 8, PHYSFS_ERR_CORRUPT, NULL);
            BAIL_IF_ERRPASS(!readui64(io, &offset), NULL);
            len -= 8;
        } /* if */

        if (starting_disk == 0xFFFFFFFF)
        {
            BAIL_IF(len < 8, PHYSFS_ERR_CORRUPT, NULL);
            BAIL_IF_ERRPASS(!readui32(io, &starting_disk), NULL);
            len -= 4;
        } /* if */

        BAIL_IF(len != 0, PHYSFS_ERR_CORRUPT, NULL);
    } /* if */

    BAIL_IF(starting_disk != 0, PHYSFS_ERR_CORRUPT, NULL);

    retval->offset = offset + ofs_fixup;

    /* seek to the start of the next entry in the central directory... */
    BAIL_IF_ERRPASS(!io->seek(io, si64 + extralen + commentlen), NULL);

    return retval;  /* success. */
}